

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall dgMeshEffect::AddPoint(dgMeshEffect *this,HaF64 *vertex,HaI32 material)

{
  dgVertexAtribute local_80;
  
  dgBigVector::dgBigVector(&local_80.m_vertex,*vertex,vertex[1],vertex[2],vertex[3]);
  AddVertex(this,&local_80.m_vertex);
  local_80._0_64_ =
       vinsertf64x4_avx512f
                 (ZEXT3264((undefined1  [32])
                           this->m_points[(long)*(int *)&(this->super_dgRefCounter).field_0xc + -1].
                           super_dgTemplateVector<double>),*(undefined1 (*) [32])(vertex + 2),1);
  local_80.m_v0 = vertex[8];
  local_80.m_u1 = vertex[9];
  local_80.m_v1 = vertex[10];
  local_80.m_material = (HaF64)(double)material;
  AddAtribute(this,&local_80);
  return;
}

Assistant:

void dgMeshEffect::AddPoint(const hacd::HaF64* vertex, hacd::HaI32 material)
{
	dgVertexAtribute attib;
	AddVertex(dgBigVector (vertex[0], vertex[1], vertex[2], vertex[3]));
	
	attib.m_vertex.m_x = m_points[m_pointCount - 1].m_x;
	attib.m_vertex.m_y = m_points[m_pointCount - 1].m_y;
	attib.m_vertex.m_z = m_points[m_pointCount - 1].m_z;
	attib.m_vertex.m_w = m_points[m_pointCount - 1].m_w;

	attib.m_normal_x = vertex[4];
	attib.m_normal_y = vertex[5];
	attib.m_normal_z = vertex[6];
	attib.m_u0 = vertex[7];
	attib.m_v0 = vertex[8];
	attib.m_u1 = vertex[9];
	attib.m_v1 = vertex[10];
	attib.m_material = material;

	AddAtribute (attib);
}